

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NewArrayExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NewArrayExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression_const*&,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,Expression **args_2,SourceRange *args_3
          )

{
  SourceRange sourceRange;
  NewArrayExpression *pNVar1;
  NewArrayExpression *in_RCX;
  SourceLocation in_RDX;
  SourceLocation in_RSI;
  Type *in_R8;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  pNVar1 = (NewArrayExpression *)
           allocate((BumpAllocator *)in_R8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  sourceRange.endLoc = in_RSI;
  sourceRange.startLoc = in_RDX;
  ast::NewArrayExpression::NewArrayExpression
            (in_RCX,in_R8,(Expression *)(in_R8->super_Symbol).name._M_len,
             *(Expression **)&in_R8->super_Symbol,sourceRange);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }